

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::ContentEncAESSettings::Write(ContentEncAESSettings *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  long *in_RSI;
  uint64 in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t payload;
  IMkvWriter *in_stack_ffffffffffffffd0;
  IMkvWriter *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  uVar2 = PayloadSize((ContentEncAESSettings *)in_stack_ffffffffffffffd0);
  bVar1 = WriteEbmlMasterElement(in_stack_ffffffffffffffd8,(uint64)in_stack_ffffffffffffffd0,in_RDI)
  ;
  if (bVar1) {
    lVar3 = (**(code **)(*in_RSI + 8))();
    if (lVar3 < 0) {
      local_1 = false;
    }
    else {
      bVar1 = WriteEbmlElement(in_stack_ffffffffffffffd0,in_RDI,0x1715f5);
      if (bVar1) {
        lVar4 = (**(code **)(*in_RSI + 8))();
        if ((lVar4 < 0) || (lVar4 - lVar3 != uVar2)) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ContentEncAESSettings::Write(IMkvWriter* writer) const {
  const uint64_t payload = PayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncAESSettings,
                              payload))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvAESSettingsCipherMode,
                        static_cast<uint64>(cipher_mode_))) {
    return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(payload))
    return false;

  return true;
}